

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall
leveldb::TableBuilder::WriteRawBlock
          (TableBuilder *this,Slice *block_contents,CompressionType type,BlockHandle *handle)

{
  Rep *pRVar1;
  WritableFile *pWVar2;
  bool bVar3;
  uint32_t value;
  size_t sVar4;
  char *data;
  Slice local_60;
  Status local_50;
  uint32_t local_44;
  char local_3d;
  uint32_t crc;
  char trailer [5];
  Rep *r;
  BlockHandle *handle_local;
  CompressionType type_local;
  Slice *block_contents_local;
  TableBuilder *this_local;
  
  pRVar1 = this->rep_;
  BlockHandle::set_offset(handle,pRVar1->offset);
  sVar4 = Slice::size(block_contents);
  BlockHandle::set_size(handle,sVar4);
  (*pRVar1->file->_vptr_WritableFile[2])(&stack0xffffffffffffffc8,pRVar1->file,block_contents);
  Status::operator=(&pRVar1->status,(Status *)&stack0xffffffffffffffc8);
  Status::~Status((Status *)&stack0xffffffffffffffc8);
  bVar3 = Status::ok(&pRVar1->status);
  if (bVar3) {
    local_3d = (char)type;
    data = Slice::data(block_contents);
    sVar4 = Slice::size(block_contents);
    local_44 = crc32c::Value(data,sVar4);
    local_44 = crc32c::Extend(local_44,&local_3d,1);
    value = crc32c::Mask(local_44);
    EncodeFixed32((char *)&crc,value);
    pWVar2 = pRVar1->file;
    Slice::Slice(&local_60,&local_3d,5);
    (*pWVar2->_vptr_WritableFile[2])(&local_50,pWVar2,&local_60);
    Status::operator=(&pRVar1->status,&local_50);
    Status::~Status(&local_50);
    bVar3 = Status::ok(&pRVar1->status);
    if (bVar3) {
      sVar4 = Slice::size(block_contents);
      pRVar1->offset = sVar4 + 5 + pRVar1->offset;
    }
  }
  return;
}

Assistant:

void TableBuilder::WriteRawBlock(const Slice& block_contents,
                                 CompressionType type, BlockHandle* handle) {
  Rep* r = rep_;
  handle->set_offset(r->offset);
  handle->set_size(block_contents.size());
  r->status = r->file->Append(block_contents);
  if (r->status.ok()) {
    char trailer[kBlockTrailerSize];
    trailer[0] = type;
    uint32_t crc = crc32c::Value(block_contents.data(), block_contents.size());
    crc = crc32c::Extend(crc, trailer, 1);  // Extend crc to cover block type
    EncodeFixed32(trailer + 1, crc32c::Mask(crc));
    r->status = r->file->Append(Slice(trailer, kBlockTrailerSize));
    if (r->status.ok()) {
      r->offset += block_contents.size() + kBlockTrailerSize;
    }
  }
}